

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O0

Edge * __thiscall s2shapeutil::EdgeIterator::edge(Edge *__return_storage_ptr__,EdgeIterator *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  EdgeIterator *local_10;
  EdgeIterator *this_local;
  
  local_10 = this;
  bVar1 = Done(this);
  if (!bVar1) {
    iVar2 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)this->shape_id_);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
              (__return_storage_ptr__,(long *)CONCAT44(extraout_var,iVar2),this->edge_id_);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_edge_iterator.cc"
             ,0x1c,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_28);
  poVar3 = std::operator<<(poVar3,"Check failed: !Done() ");
  S2LogMessageVoidify::operator&(&local_11,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

S2Shape::Edge EdgeIterator::edge() const {
  S2_DCHECK(!Done());
  return index_->shape(shape_id_)->edge(edge_id_);
}